

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O2

void Aig_ManRegPartitionAdd(Aig_ManPre_t *p,int iReg)

{
  char cVar1;
  char *pcVar2;
  int *piVar3;
  Vec_Flt_t *pVVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  float *pfVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  
  if (p->pfUsedRegs[iReg] == '\0') {
    p->pfUsedRegs[iReg] = '\x01';
    Vec_IntPush(p->vUniques,iReg);
  }
  pVVar6 = p->vFreeVars;
  pcVar2 = p->pfPartVars;
  uVar8 = (ulong)pVVar6->nSize;
  cVar1 = pcVar2[iReg];
  if ((long)uVar8 < 1) {
    if (cVar1 != '\0') {
      __assert_fail("!p->pfPartVars[iReg]",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartReg.c"
                    ,0xdb,"void Aig_ManRegPartitionAdd(Aig_ManPre_t *, int)");
    }
  }
  else {
    if (cVar1 == '\0') {
      __assert_fail("p->pfPartVars[iReg]",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartReg.c"
                    ,0xd6,"void Aig_ManRegPartitionAdd(Aig_ManPre_t *, int)");
    }
    piVar3 = pVVar6->pArray;
    lVar10 = 1;
    while( true ) {
      if (lVar10 - uVar8 == 1) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartReg.c"
                      ,0xd8,"void Aig_ManRegPartitionAdd(Aig_ManPre_t *, int)");
      }
      if (piVar3[lVar10 + -1] == iReg) break;
      lVar10 = lVar10 + 1;
    }
    for (; (int)lVar10 < (int)uVar8; lVar10 = lVar10 + 1) {
      piVar3[lVar10 + -1] = piVar3[lVar10];
      uVar8 = (ulong)(uint)pVVar6->nSize;
    }
    pVVar6->nSize = (int)uVar8 + -1;
  }
  pcVar2[iReg] = '\x01';
  Vec_IntPush(p->vRegs,iReg);
  pVVar6 = (Vec_Int_t *)Vec_PtrEntry(p->vMatrix,iReg);
  for (iVar9 = 0; iVar9 < pVVar6->nSize; iVar9 = iVar9 + 1) {
    iVar5 = Vec_IntEntry(pVVar6,iVar9);
    if (p->pfPartVars[iVar5] == '\0') {
      p->pfPartVars[iVar5] = '\x01';
      Vec_IntPush(p->vFreeVars,iVar5);
    }
  }
  pVVar4 = p->vPartCost;
  iVar9 = p->vFreeVars->nSize;
  iVar5 = p->vRegs->nSize;
  iVar12 = pVVar4->nSize;
  if (iVar12 == pVVar4->nCap) {
    uVar11 = 0x10;
    if (0xf < iVar12) {
      uVar11 = iVar12 * 2;
    }
    if (iVar12 < (int)uVar11) {
      if (pVVar4->pArray == (float *)0x0) {
        pfVar7 = (float *)malloc((ulong)uVar11 << 2);
      }
      else {
        pfVar7 = (float *)realloc(pVVar4->pArray,(ulong)uVar11 << 2);
        iVar12 = pVVar4->nSize;
      }
      pVVar4->pArray = pfVar7;
      pVVar4->nCap = uVar11;
    }
  }
  pVVar4->nSize = iVar12 + 1;
  pVVar4->pArray[iVar12] = (float)iVar9 / (float)iVar5;
  return;
}

Assistant:

void Aig_ManRegPartitionAdd( Aig_ManPre_t * p, int iReg )
{
    Vec_Int_t * vSupp;
    int RetValue, iVar, i;
    // make sure this is a new variable
//    assert( !p->pfUsedRegs[iReg] );
    if ( !p->pfUsedRegs[iReg] )
    {
        p->pfUsedRegs[iReg] = 1;
        Vec_IntPush( p->vUniques, iReg );
    }
    // remove it from the free variables
    if ( Vec_IntSize(p->vFreeVars) > 0 )
    {
        assert( p->pfPartVars[iReg] );
        RetValue = Vec_IntRemove( p->vFreeVars, iReg );
        assert( RetValue );
    }
    else
        assert( !p->pfPartVars[iReg] );
    // add it to the partition
    p->pfPartVars[iReg] = 1;
    Vec_IntPush( p->vRegs, iReg );
    // add new variables
    vSupp = (Vec_Int_t *)Vec_PtrEntry( p->vMatrix, iReg );
    Vec_IntForEachEntry( vSupp, iVar, i )
    {
        if ( p->pfPartVars[iVar] )
            continue;
        p->pfPartVars[iVar] = 1;
        Vec_IntPush( p->vFreeVars, iVar );
    }
    // add it to the cost
    Vec_FltPush( p->vPartCost, 1.0*Vec_IntSize(p->vFreeVars)/Vec_IntSize(p->vRegs) );
}